

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

bool __thiscall
ON_3dmObjectAttributes::IsInGroups(ON_3dmObjectAttributes *this,int group_count,int *group_list)

{
  int iVar1;
  int *piVar2;
  int local_40;
  int local_3c;
  int j;
  int i;
  int *obj_group_list;
  int obj_group_count;
  bool rc;
  int *group_list_local;
  int group_count_local;
  ON_3dmObjectAttributes *this_local;
  
  if ((0 < group_count) && (group_list != (int *)0x0)) {
    iVar1 = GroupCount(this);
    piVar2 = GroupList(this);
    for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < group_count; local_40 = local_40 + 1) {
        if (piVar2[local_3c] == group_list[local_40]) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_3dmObjectAttributes::IsInGroups( int group_count, const int* group_list ) const
{
  // returns true if object is in any of the groups in the list
  bool rc = false;
  if ( group_count > 0 && group_list ) {
    const int obj_group_count  = GroupCount();
    const int* obj_group_list = GroupList();
    // in practice these arrays will be very short and this search will be fast
    int i, j;
    for ( i = 0; i < obj_group_count; i++ ) for ( j = 0; j < group_count; j++ ) {
      if ( obj_group_list[i] == group_list[j] )
        return true;
    }
  }
  return rc;
}